

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

ostream * std::operator<<(ostream *ofs,Reference *v)

{
  Reference *pRVar1;
  bool bVar2;
  Dictionary *customData;
  allocator local_59;
  string local_58;
  string local_38;
  Reference *local_18;
  Reference *v_local;
  ostream *ofs_local;
  
  local_18 = v;
  v_local = (Reference *)ofs;
  operator<<(ofs,&v->asset_path);
  bVar2 = tinyusdz::Path::is_valid(&local_18->prim_path);
  if (bVar2) {
    operator<<((ostream *)v_local,&local_18->prim_path);
  }
  operator<<((ostream *)v_local,&local_18->layerOffset);
  bVar2 = map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
          ::empty(&local_18->customData);
  pRVar1 = v_local;
  if (!bVar2) {
    customData = &local_18->customData;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,"customData",&local_59);
    tinyusdz::print_customData(&local_38,customData,&local_58,0);
    std::operator<<((ostream *)pRVar1,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  return (ostream *)v_local;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const tinyusdz::Reference &v) {
  ofs << v.asset_path;
  if (v.prim_path.is_valid()) {
    ofs << v.prim_path;
  }
  ofs << v.layerOffset;
  if (!v.customData.empty()) {
    ofs << tinyusdz::print_customData(v.customData, "customData",
                                      /* indent */ 0);
  }

  return ofs;
}